

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

void __thiscall Ptex::v2_4::PtexReader::readLevelInfo(PtexReader *this)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  value_type vVar4;
  PtexReader *in_RDI;
  vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_> *unaff_retaddr;
  int i;
  FilePos pos;
  FilePos in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffeb;
  int in_stack_ffffffffffffffec;
  int iVar5;
  vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_> *in_stack_fffffffffffffff0;
  value_type vVar6;
  PtexReader *this_00;
  
  this_00 = in_RDI;
  bVar1 = std::vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_>::empty
                    (in_stack_fffffffffffffff0);
  if (bVar1) {
    seek(in_RDI,in_stack_ffffffffffffffd8);
    std::vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_>::resize
              (unaff_retaddr,(size_type)this_00);
    std::vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_>::operator[]
              (&in_RDI->_levelinfo,0);
    readBlock(this_00,in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,
              (bool)in_stack_ffffffffffffffeb);
    std::vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>::
    resize((vector<Ptex::v2_4::PtexReader::Level_*,_std::allocator<Ptex::v2_4::PtexReader::Level_*>_>
            *)unaff_retaddr,(size_type)this_00);
    std::vector<long,_std::allocator<long>_>::resize
              ((vector<long,_std::allocator<long>_> *)unaff_retaddr,(size_type)this_00);
    vVar4 = in_RDI->_leveldatapos;
    for (iVar5 = 0; iVar5 < (int)(uint)(in_RDI->_header).nlevels; iVar5 = iVar5 + 1) {
      vVar6 = vVar4;
      pvVar2 = std::vector<long,_std::allocator<long>_>::operator[](&in_RDI->_levelpos,(long)iVar5);
      *pvVar2 = vVar4;
      pvVar3 = std::vector<Ptex::v2_4::LevelInfo,_std::allocator<Ptex::v2_4::LevelInfo>_>::
               operator[](&in_RDI->_levelinfo,(long)iVar5);
      vVar4 = pvVar3->leveldatasize + vVar6;
    }
    increaseMemUsed(in_RDI,(ulong)(in_RDI->_header).nlevels * 0x10 + 0x10);
  }
  return;
}

Assistant:

void PtexReader::readLevelInfo()
{
    if (_levelinfo.empty()) {
        // read level info block
        seek(_levelinfopos);
        _levelinfo.resize(_header.nlevels);
        readBlock(&_levelinfo[0], LevelInfoSize*_header.nlevels);

        // initialize related data
        _levels.resize(_header.nlevels);
        _levelpos.resize(_header.nlevels);
        FilePos pos = _leveldatapos;
        for (int i = 0; i < _header.nlevels; i++) {
            _levelpos[i] = pos;
            pos += _levelinfo[i].leveldatasize;
        }
        increaseMemUsed(_header.nlevels * sizeof(_levelinfo[0]) + sizeof(_levels[0]) + sizeof(_levelpos[0]));
    }
}